

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

int Psr_ManReadList3(Psr_Man_t *p)

{
  int iVar1;
  int iToken;
  Psr_Man_t *p_local;
  
  Vec_IntClear(&p->vTemp);
  while( true ) {
    iVar1 = Psr_ManIsChar(p,'\n');
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(&p->vTemp);
      if (iVar1 == 0) {
        p_local._4_4_ = Psr_ManErrorSet(p,"Cannot read a list of formal/actual names.",1);
      }
      else {
        iVar1 = Vec_IntSize(&p->vTemp);
        if (iVar1 % 2 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = Psr_ManErrorSet(p,"The number of formal/actual names is not even.",1);
        }
      }
      return p_local._4_4_;
    }
    iVar1 = Psr_ManReadName(p);
    if (iVar1 == 0) {
      iVar1 = Psr_ManErrorSet(p,"Cannot read formal name.",1);
      return iVar1;
    }
    Vec_IntPush(&p->vTemp,iVar1);
    Psr_ManSkipSpaces(p);
    iVar1 = Psr_ManIsChar2(p,'=');
    if (iVar1 == 0) {
      iVar1 = Psr_ManErrorSet(p,"Cannot find symbol \"=\".",1);
      return iVar1;
    }
    iVar1 = Psr_ManReadName(p);
    if (iVar1 == 0) break;
    Vec_IntPush(&p->vTemp,iVar1);
    Psr_ManSkipSpaces(p);
  }
  iVar1 = Psr_ManErrorSet(p,"Cannot read actual name.",1);
  return iVar1;
}

Assistant:

static inline int Psr_ManReadList3( Psr_Man_t * p )
{
    Vec_IntClear( &p->vTemp );
    while ( !Psr_ManIsChar(p, '\n') )
    {
        int iToken = Psr_ManReadName(p);
        if ( iToken == 0 )              return Psr_ManErrorSet(p, "Cannot read formal name.", 1);
        Vec_IntPush( &p->vTemp, iToken );
        Psr_ManSkipSpaces( p );
        if ( !Psr_ManIsChar2(p, '=') )  return Psr_ManErrorSet(p, "Cannot find symbol \"=\".", 1);
        iToken = Psr_ManReadName(p);
        if ( iToken == 0 )              return Psr_ManErrorSet(p, "Cannot read actual name.", 1);
        Vec_IntPush( &p->vTemp, iToken );
        Psr_ManSkipSpaces( p );
    }
    if ( Vec_IntSize(&p->vTemp) == 0 )  return Psr_ManErrorSet(p, "Cannot read a list of formal/actual names.", 1);
    if ( Vec_IntSize(&p->vTemp) % 2  )  return Psr_ManErrorSet(p, "The number of formal/actual names is not even.", 1);
    return 0;
}